

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_assign_from_any.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  bool *pbVar2;
  bool local_19;
  any b;
  any local_10;
  
  b._value = (erasure *)0x0;
  local_19 = true;
  type::any::any<bool>(&local_10,&local_19);
  type::any::operator=(&b,&local_10);
  if (local_10._value != (erasure *)0x0) {
    (*(local_10._value)->_vptr_erasure[1])();
  }
  pbVar2 = type::any::as<bool>(&b);
  bVar1 = *pbVar2;
  if (b._value != (erasure *)0x0) {
    (*(b._value)->_vptr_erasure[1])();
  }
  return -(bVar1 ^ 1);
}

Assistant:

int main() {
    try {
      type::any b;
      b = type::any(true);
      if (b.as<bool>()) {
        return 0;
      }
      return -1;
    }
    catch(...) {
      return -1;
    }
}